

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O1

int get_one_number(dmr_C *C,int c,int next,stream_t *stream)

{
  tokenizer_state_t *ptVar1;
  ulong uVar2;
  token *ptVar3;
  char *__dest;
  char *pcVar4;
  long lVar5;
  
  ptVar1 = C->T;
  ptVar1->number_buffer[0] = (char)c;
  lVar5 = 0xeceb;
  do {
    uVar2 = C->T->cclass[next + 1];
    if ((uVar2 & 0x13) != 0) {
      if (lVar5 != 0xfce9) {
        ptVar1->special[lVar5 + -0x14] = (char)next;
        lVar5 = lVar5 + 1;
      }
      next = nextchar(C,stream);
      if (((uVar2 & 8) != 0) && ((next == 0x2d || (next == 0x2b)))) {
        if (lVar5 != 0xfce9) {
          ptVar1->special[lVar5 + -0x14] = (char)next;
          lVar5 = lVar5 + 1;
        }
        next = nextchar(C,stream);
      }
    }
  } while ((uVar2 & 0x13) != 0);
  if (lVar5 == 0xfce9) {
    pcVar4 = ptVar1->number_buffer + 1;
    dmrC_sparse_error(C,(position)
                        (CONCAT44(stream->line,
                                  (stream->whitespace & 1U) << 0x15 |
                                  (stream->nr & 0x3fffU) << 6 | (stream->newline & 1U) << 0x14 |
                                  stream->pos << 0x16) & 0x7fffffffffffffff),
                      "number token exceeds %td characters",0xfff);
    ptVar1->number_buffer[0] = '1';
  }
  else {
    pcVar4 = ptVar1->special + lVar5 + -0x14;
  }
  *pcVar4 = '\0';
  __dest = (char *)dmrC_allocator_allocate
                             (&C->byte_allocator,
                              (size_t)(pcVar4 + (1 - (long)ptVar1->number_buffer)));
  memcpy(__dest,ptVar1->number_buffer,(size_t)(pcVar4 + (1 - (long)ptVar1->number_buffer)));
  ptVar3 = stream->token;
  ptVar3->pos = (position)((ulong)ptVar3->pos & 0xffffffffffffffc0 | 4);
  (ptVar3->field_2).number = __dest;
  ptVar3 = stream->token;
  stream->token = (token *)0x0;
  ptVar3->next = (token *)0x0;
  *stream->tokenlist = ptVar3;
  stream->tokenlist = &ptVar3->next;
  return next;
}

Assistant:

static int get_one_number(struct dmr_C *C, int c, int next, stream_t *stream)
{
	struct token *token;
	char *buffer = C->T->number_buffer;
	char *p = buffer, *buf, *buffer_end = buffer + sizeof C->T->number_buffer;
	size_t len;

	*p++ = c;
	for (;;) {
		long kclass = C->T->cclass[next + 1];
		if (!(kclass & (Dot | Digit | Letter)))
			break;
		if (p != buffer_end)
			*p++ = next;
		next = nextchar(C, stream);
		if (kclass & Exp) {
			if (next == '-' || next == '+') {
				if (p != buffer_end)
					*p++ = next;
				next = nextchar(C, stream);
			}
		}
	}

	if (p == buffer_end) {
		dmrC_sparse_error(C, stream_pos(stream),
			     "number token exceeds %td characters",
			     buffer_end - buffer);
		// Pretend we saw just "1".
		buffer[0] = '1';
		p = buffer + 1;
	}

	*p++ = 0;
	len = p - buffer;
	buf = (char *)dmrC_allocator_allocate(&C->byte_allocator, len);
	memcpy(buf, buffer, len);

	token = stream->token;
	dmrC_token_type(token) = TOKEN_NUMBER;
	token->number = buf;
	add_token(stream);

	return next;
}